

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_class.c
# Opt level: O1

void oonf_class_event(oonf_class *c,void *ptr,oonf_class_event evt)

{
  char *pcVar1;
  char *pcVar2;
  undefined8 uVar3;
  list_entity *plVar4;
  ulong uVar5;
  list_entity *plVar6;
  oonf_objectkey_str buf;
  
  uVar5 = (ulong)_oonf_class_subsystem.logging;
  if (((&log_global_mask)[uVar5] & 1) != 0) {
    pcVar1 = OONF_CLASS_EVENT_NAME[evt];
    pcVar2 = (*c->to_keystring)(&buf,c,ptr);
    oonf_log(1,uVar5,"src/base/oonf_class.c",0x143,0,0,"Fire \'%s\' event for %s",pcVar1,pcVar2);
  }
  plVar4 = (c->_extensions).next;
  do {
    if (plVar4->prev == (c->_extensions).prev) {
      if (((&log_global_mask)[_oonf_class_subsystem.logging] & 1) != 0) {
        oonf_log(1,(ulong)_oonf_class_subsystem.logging,"src/base/oonf_class.c",0x152,0,0,
                 "Fire event finished");
      }
      return;
    }
    if (evt == OONF_OBJECT_CHANGED) {
      if (plVar4[-1].next != (list_entity *)0x0) {
        plVar6 = plVar4 + -1;
        if (((&log_global_mask)[_oonf_class_subsystem.logging] & 1) != 0) {
          uVar3 = 0x14e;
          goto LAB_00117325;
        }
        goto LAB_00117342;
      }
    }
    else if (evt == OONF_OBJECT_REMOVED) {
      if (plVar4[-1].prev != (list_entity *)0x0) {
        plVar6 = (list_entity *)&plVar4[-1].prev;
        if (((&log_global_mask)[_oonf_class_subsystem.logging] & 1) != 0) {
          uVar3 = 0x14a;
          goto LAB_00117325;
        }
        goto LAB_00117342;
      }
    }
    else if ((evt == OONF_OBJECT_ADDED) && (plVar4[-2].prev != (list_entity *)0x0)) {
      plVar6 = (list_entity *)&plVar4[-2].prev;
      if (((&log_global_mask)[_oonf_class_subsystem.logging] & 1) != 0) {
        uVar3 = 0x146;
LAB_00117325:
        oonf_log(1,_oonf_class_subsystem.logging,"src/base/oonf_class.c",uVar3,0,0,
                 "Fire listener %s",plVar4[-4].prev);
      }
LAB_00117342:
      (*(code *)plVar6->next)(ptr);
    }
    plVar4 = plVar4->next;
  } while( true );
}

Assistant:

void
oonf_class_event(struct oonf_class *c, void *ptr, enum oonf_class_event evt) {
  struct oonf_class_extension *ext;
#ifdef OONF_LOG_DEBUG_INFO
  struct oonf_objectkey_str buf;
#endif

  OONF_DEBUG(LOG_CLASS, "Fire '%s' event for %s", OONF_CLASS_EVENT_NAME[evt], c->to_keystring(&buf, c, ptr));
  list_for_each_element(&c->_extensions, ext, _node) {
    if (evt == OONF_OBJECT_ADDED && ext->cb_add != NULL) {
      OONF_DEBUG(LOG_CLASS, "Fire listener %s", ext->ext_name);
      ext->cb_add(ptr);
    }
    else if (evt == OONF_OBJECT_REMOVED && ext->cb_remove != NULL) {
      OONF_DEBUG(LOG_CLASS, "Fire listener %s", ext->ext_name);
      ext->cb_remove(ptr);
    }
    else if (evt == OONF_OBJECT_CHANGED && ext->cb_change != NULL) {
      OONF_DEBUG(LOG_CLASS, "Fire listener %s", ext->ext_name);
      ext->cb_change(ptr);
    }
  }
  OONF_DEBUG(LOG_CLASS, "Fire event finished");
}